

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElement.cpp
# Opt level: O2

void __thiscall
iDynTree::XMLElement::XMLElementPimpl::XMLElementPimpl
          (XMLElementPimpl *this,XMLParserState *parserState,string *name,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
          *attributes)

{
  (this->f_childParsed).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_childParsed)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_childParsed).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_childParsed).super__Function_base._M_functor + 8) = 0;
  (this->f_exitScope).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_exitScope)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_exitScope).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_exitScope).super__Function_base._M_functor + 8) = 0;
  (this->f_attribute).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_attribute)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_attribute).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_attribute).super__Function_base._M_functor + 8) = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_charactersStream);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  (this->m_children).
  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).
  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).
  super__Vector_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->m_attributes)._M_h,&attributes->_M_h);
  this->m_parserState = parserState;
  return;
}

Assistant:

explicit XMLElementPimpl(XMLParserState& parserState,
                                 const std::string& name,
                                 const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>>& attributes)
                                 : m_name(name), m_attributes(attributes), m_parserState(parserState) {}